

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O2

bc_slist_t * bc_slist_sort(bc_slist_t *l,bc_sort_func_t cmp)

{
  _bc_slist_t *p_Var1;
  void *pvVar2;
  int iVar3;
  bc_slist_t *pbVar4;
  bool bVar5;
  bc_slist_t *pbVar6;
  
  if (l != (bc_slist_t *)0x0) {
    pbVar6 = (bc_slist_t *)0x0;
    do {
      bVar5 = false;
      p_Var1 = l;
      while (pbVar4 = p_Var1, pbVar4->next != pbVar6) {
        iVar3 = (*cmp)(pbVar4->data,pbVar4->next->data);
        p_Var1 = pbVar4->next;
        if (0 < iVar3) {
          pvVar2 = pbVar4->data;
          pbVar4->data = p_Var1->data;
          p_Var1->data = pvVar2;
          bVar5 = true;
        }
      }
      pbVar6 = pbVar4;
    } while (bVar5);
  }
  return l;
}

Assistant:

bc_slist_t*
bc_slist_sort(bc_slist_t *l, bc_sort_func_t cmp)
{
    if (l == NULL) {
        return NULL;
    }

    bool swapped = false;
    bc_slist_t *lptr = NULL;
    bc_slist_t *rptr = NULL;

    do {
        swapped = false;
        lptr = l;

        while (lptr->next != rptr) {
            if (0 < cmp(lptr->data, lptr->next->data)) {
                void *tmp = lptr->data;
                lptr->data = lptr->next->data;
                lptr->next->data = tmp;
                swapped = true;
            }

            lptr = lptr->next;
        }

        rptr = lptr;
    } while(swapped);

    return l;
}